

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite_result.cpp
# Opt level: O3

void __thiscall cpp_db::sqlite_result::move_next(sqlite_result *this)

{
  int error;
  uint uVar1;
  sqlite3_stmt *psVar2;
  sqlite_exception *this_00;
  sqlite3 *db;
  
  psVar2 = get_stmt_handle(this);
  uVar1 = sqlite3_step(psVar2);
  this->row_status = uVar1;
  if ((uVar1 & 0xfffffffe) == 100) {
    return;
  }
  this_00 = (sqlite_exception *)__cxa_allocate_exception(0x18);
  error = this->row_status;
  psVar2 = get_stmt_handle(this);
  db = (sqlite3 *)sqlite3_db_handle(psVar2);
  sqlite_exception::sqlite_exception(this_00,error,db);
  __cxa_throw(this_00,&sqlite_exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void sqlite_result::move_next()
{
	row_status = sqlite3_step(get_stmt_handle());
    if (row_status != SQLITE_DONE && row_status != SQLITE_ROW)
        throw sqlite_exception(row_status, sqlite3_db_handle(get_stmt_handle()));
}